

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O0

void __thiscall Iir::LayoutBase::add(LayoutBase *this,ComplexPair *poles,ComplexPair *zeros)

{
  bool bVar1;
  PoleZeroPair *in_RDI;
  PoleZeroPair *in_stack_ffffffffffffff98;
  complex_t *in_stack_ffffffffffffffa8;
  complex_t *in_stack_ffffffffffffffb0;
  ComplexPair *in_stack_ffffffffffffffb8;
  PoleZeroPair *in_stack_ffffffffffffffc0;
  
  if ((*(uint *)(in_RDI->poles).super_complex_pair_t.first._M_value & 1) != 0) {
    throw_invalid_argument((char *)in_stack_ffffffffffffffb0);
  }
  bVar1 = ComplexPair::isMatchedPair(in_stack_ffffffffffffffb8);
  if (!bVar1) {
    throw_invalid_argument((char *)in_stack_ffffffffffffffb0);
  }
  bVar1 = ComplexPair::isMatchedPair(in_stack_ffffffffffffffb8);
  if (!bVar1) {
    throw_invalid_argument((char *)in_stack_ffffffffffffffb0);
  }
  PoleZeroPair::PoleZeroPair
            (in_stack_ffffffffffffffc0,(complex_t *)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(complex_t *)in_RDI);
  PoleZeroPair::operator=(in_RDI,in_stack_ffffffffffffff98);
  *(int *)(in_RDI->poles).super_complex_pair_t.first._M_value =
       *(int *)(in_RDI->poles).super_complex_pair_t.first._M_value + 2;
  return;
}

Assistant:

void add (const ComplexPair& poles, const ComplexPair& zeros)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (!poles.isMatchedPair ())
				throw_invalid_argument(errPolesNotComplexConj);
			if (!zeros.isMatchedPair ())
				throw_invalid_argument(errZerosNotComplexConj);
			m_pair[m_numPoles/2] = PoleZeroPair (poles.first, zeros.first,
							     poles.second, zeros.second);
			m_numPoles += 2;
		}